

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O2

void maxCliqueHelper(CGraphIO *gio,vector<int,_std::allocator<int>_> *U,int sizeOfClique,int *maxClq
                    ,vector<int,_std::allocator<int>_> *max_clique_data_inter)

{
  vector<int,_std::allocator<int>_> *ptrVtx;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  int i;
  int index;
  vector<int,_std::allocator<int>_> U_new;
  uint local_74;
  int *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  int local_5c;
  _Vector_base<int,_std::allocator<int>_> local_58;
  long local_38;
  
  local_74 = 0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = maxClq;
  local_68 = max_clique_data_inter;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_58,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 == piVar3) {
    if (*local_70 < sizeOfClique) {
      *local_70 = sizeOfClique;
      piVar3 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar3) {
        (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar3;
      }
    }
  }
  else {
    ptrVtx = &gio->m_vi_Vertices;
    local_38 = (long)sizeOfClique;
    local_5c = sizeOfClique + 1;
    while (((long)piVar2 - (long)piVar3 != 0 &&
           ((ulong)(long)*local_70 < (ulong)(((long)piVar2 - (long)piVar3 >> 2) + local_38)))) {
      local_74 = piVar2[-1];
      uVar4 = (ulong)(int)local_74;
      (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           piVar2 + -1;
      piVar3 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar5 = (long)piVar3[uVar4]; lVar5 < piVar3[(long)(int)uVar4 + 1]; lVar5 = lVar5 + 1) {
        iVar1 = getDegree(ptrVtx,(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar5]);
        if (iVar1 < *local_70) {
          pruned3 = pruned3 + 1;
        }
        else {
          for (uVar4 = 0;
              piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,
              uVar4 < (ulong)((long)(U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
              uVar4 = uVar4 + 1) {
            piVar2 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar2[lVar5] == piVar3[uVar4]) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&local_58,piVar2 + lVar5);
            }
          }
        }
        uVar4 = (ulong)local_74;
        piVar3 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar1 = *local_70;
      maxCliqueHelper(gio,(vector<int,_std::allocator<int>_> *)&local_58,local_5c,local_70,local_68)
      ;
      if (iVar1 < *local_70) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (local_68,(value_type_conflict1 *)&local_74);
      }
      if (local_58._M_impl.super__Vector_impl_data._M_finish !=
          local_58._M_impl.super__Vector_impl_data._M_start) {
        local_58._M_impl.super__Vector_impl_data._M_finish =
             local_58._M_impl.super__Vector_impl_data._M_start;
      }
      piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      piVar2 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void maxCliqueHelper( CGraphIO& gio, vector<int>* U, int sizeOfClique, int& maxClq, vector<int>& max_clique_data_inter )
{
	int iPos, index = 0, maxClq_prev;
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U_new;
   U_new.reserve(gio.GetVertexCount());

	if( U->size() == 0  )
	{
		if( sizeOfClique > maxClq )
		{
			maxClq = sizeOfClique;
         max_clique_data_inter.clear();
		}
		return;
	}

	while( U->size() > 0 )
	{
		//Old Pruning
		if( sizeOfClique + U->size() <= maxClq )
			return;

		index = U->back();
		U->pop_back();

		// Loop over neighbrs of v_index.
		for(int j = (*ptrVertex)[index]; j < (*ptrVertex)[index + 1]; j++ )
			//Pruning 5
			if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )
			{
				// Loop over U.
				for(int i = 0; i < U->size(); i++)
				{
					if( (*ptrEdge)[j] == (*U)[i] )
						U_new.push_back( (*ptrEdge)[j]);
				}
			}
			else
				pruned3++;

      maxClq_prev = maxClq;

      maxCliqueHelper( gio, &U_new, sizeOfClique + 1, maxClq, max_clique_data_inter );

      if(maxClq > maxClq_prev)
         max_clique_data_inter.push_back(index);

		U_new.clear();
	}
}